

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  int *piVar1;
  uint *puVar2;
  ImGuiID IVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  uint *__dest;
  int iVar7;
  int iVar8;
  
  memset(this,0,0x3c0);
  pcVar5 = ImStrdup(name);
  this->Name = pcVar5;
  sVar6 = strlen(name);
  this->NameBufLen = (int)sVar6 + 1;
  IVar3 = ImHashStr(name,0,0);
  this->ID = IVar3;
  iVar7 = (this->IDStack).Size;
  if (iVar7 == (this->IDStack).Capacity) {
    if (iVar7 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar7 / 2 + iVar7;
    }
    iVar8 = iVar7 + 1;
    if (iVar7 + 1 < iVar4) {
      iVar8 = iVar4;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
    puVar2 = (this->IDStack).Data;
    if (puVar2 != (uint *)0x0) {
      memcpy(__dest,puVar2,(long)(this->IDStack).Size << 2);
      puVar2 = (this->IDStack).Data;
      if ((puVar2 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
    }
    (this->IDStack).Data = __dest;
    (this->IDStack).Capacity = iVar8;
    IVar3 = this->ID;
    iVar7 = (this->IDStack).Size;
  }
  else {
    __dest = (this->IDStack).Data;
  }
  __dest[iVar7] = IVar3;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  IVar3 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar3;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoPosLastDirection = -1;
  *(uint *)&this->field_0xbc = (uint)(byte)this->field_0xbf << 0x18 | 0xf0f0f;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._Data = &context->DrawListSharedData;
  (this->DrawListInst)._OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}